

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_free(REF_HISTOGRAM ref_histogram)

{
  REF_HISTOGRAM ref_histogram_local;
  
  if (ref_histogram == (REF_HISTOGRAM)0x0) {
    ref_histogram_local._4_4_ = 2;
  }
  else {
    if (ref_histogram->df != (FILE *)0x0) {
      fclose((FILE *)ref_histogram->df);
    }
    if (ref_histogram->stats != (REF_DBL *)0x0) {
      free(ref_histogram->stats);
    }
    if (ref_histogram->bins != (REF_INT *)0x0) {
      free(ref_histogram->bins);
    }
    if (ref_histogram != (REF_HISTOGRAM)0x0) {
      free(ref_histogram);
    }
    ref_histogram_local._4_4_ = 0;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_free(REF_HISTOGRAM ref_histogram) {
  if (NULL == (void *)ref_histogram) return REF_NULL;
  if (NULL != ref_histogram->df) fclose(ref_histogram->df);
  ref_free(ref_histogram->stats);
  ref_free(ref_histogram->bins);
  ref_free(ref_histogram);
  return REF_SUCCESS;
}